

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall
ON_NurbsSurface::SetPeriodicGrevilleKnotVector(ON_NurbsSurface *this,int dir,int g_stride,double *g)

{
  bool bVar1;
  int capacity;
  double *knot;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  knot = this->m_knot[dir];
  if (knot == (double *)0x0) {
    if ((this->m_order[dir] < 2) || (this->m_cv_count[dir] < this->m_order[dir])) {
      knot = (double *)0x0;
    }
    else {
      capacity = ON_KnotCount(this->m_order[dir != 0],this->m_cv_count[dir != 0]);
      ReserveKnotCapacity(this,dir,capacity);
      knot = this->m_knot[dir];
    }
  }
  bVar1 = ON_GetGrevilleKnotVector
                    (g_stride,g,true,this->m_order[dir != 0],this->m_cv_count[dir != 0],knot);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::SetPeriodicGrevilleKnotVector(
         int dir,        // dir
         int g_stride,   // g_stride
         const double* g // g[], Greville abcissa
         )
{
  DestroySurfaceTree();
  if ( !m_knot[dir] && m_order[dir] >= 2 && m_cv_count[dir] >= m_order[dir] )
    ReserveKnotCapacity(dir,KnotCount(dir));
  return ON_GetGrevilleKnotVector( g_stride, g, true, Order(dir), CVCount(dir), m_knot[dir] );
}